

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

void __thiscall amrex::FabArrayBase::RB90::~RB90(RB90 *this)

{
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::~unique_ptr(&(this->super_CommMetaData).m_RcvTags);
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::~unique_ptr(&(this->super_CommMetaData).m_SndTags);
  std::
  unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  ::~unique_ptr(&(this->super_CommMetaData).m_LocTags);
  return;
}

Assistant:

FabArrayBase::RB90::~RB90 ()
{}